

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool __thiscall
gguf_reader::read<signed_char>
          (gguf_reader *this,vector<signed_char,_std::allocator<signed_char>_> *dst,size_t n)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(dst,n);
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pcVar1 = (dst->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(dst->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    if (uVar5 <= uVar4) break;
    bVar3 = read<signed_char>(this,pcVar1 + uVar4);
    uVar2 = uVar4 + 1;
  } while (bVar3);
  return uVar5 <= uVar4;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }